

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O0

int32 dumbfile_getnc(char *ptr,int32 n,DUMBFILE *f)

{
  int iVar1;
  long *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  int c;
  int32 rv;
  int local_2c;
  int local_24;
  undefined1 *local_10;
  int32 local_4;
  
  if (in_RDX[2] < 0) {
    local_4 = -1;
  }
  else {
    if (*(long *)(*in_RDX + 0x18) == 0) {
      local_10 = in_RDI;
      for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
        iVar1 = (**(code **)(*in_RDX + 0x10))(in_RDX[1]);
        if (iVar1 < 0) {
          in_RDX[2] = -1;
          return local_24;
        }
        *local_10 = (char)iVar1;
        local_10 = local_10 + 1;
      }
    }
    else {
      local_2c = (**(code **)(*in_RDX + 0x18))(in_RDI,in_ESI,in_RDX[1]);
      local_24 = local_2c;
      if (local_2c < in_ESI) {
        in_RDX[2] = -1;
        if (local_2c < 1) {
          local_2c = 0;
        }
        return local_2c;
      }
    }
    in_RDX[2] = (long)local_24 + in_RDX[2];
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

int32 DUMBEXPORT dumbfile_getnc(char *ptr, int32 n, DUMBFILE *f)
{
	int32 rv;

	ASSERT(f);
	ASSERT(n >= 0);

	if (f->pos < 0)
		return -1;

	if (f->dfs->getnc) {
		rv = (*f->dfs->getnc)(ptr, n, f->file);
		if (rv < n) {
			f->pos = -1;
			return MAX(rv, 0);
		}
	} else {
		for (rv = 0; rv < n; rv++) {
			int c = (*f->dfs->getc)(f->file);
			if (c < 0) {
				f->pos = -1;
				return rv;
			}
			*ptr++ = c;
		}
	}

	f->pos += rv;

	return rv;
}